

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O2

Interval __thiscall pbrt::Interval::operator*(Interval *this,Interval i)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  int iVar10;
  float fVar11;
  undefined1 in_register_00001208 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  float local_48;
  int local_44;
  int local_40;
  int local_3c;
  float local_38;
  int local_34;
  int local_30;
  int local_2c;
  undefined1 extraout_var [60];
  
  auVar12._8_56_ = in_register_00001208;
  auVar12._0_8_ = i;
  local_34 = -0x800000;
  local_38 = -INFINITY;
  fVar11 = i.low * this->low;
  if (-INFINITY < fVar11) {
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar11),ZEXT816(0) << 0x40,0);
    bVar6 = (bool)((byte)uVar2 & 1);
    fVar3 = (float)((uint)bVar6 * -0x80000000 + (uint)!bVar6 * (int)fVar11);
    local_38 = (float)((int)fVar3 + -1 + (uint)(fVar3 <= 0.0) * 2);
  }
  fVar3 = i.low * this->high;
  if (-INFINITY < fVar3) {
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar3),ZEXT816(0) << 0x40,0);
    bVar6 = (bool)((byte)uVar2 & 1);
    fVar4 = (float)((uint)bVar6 * -0x80000000 + (uint)!bVar6 * (int)fVar3);
    local_34 = (int)fVar4 + -1 + (uint)(fVar4 <= 0.0) * 2;
  }
  auVar14 = vmovshdup_avx(auVar12._0_16_);
  local_2c = -0x800000;
  local_30 = -0x800000;
  fVar4 = auVar14._0_4_ * this->low;
  if (-INFINITY < fVar4) {
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar4),ZEXT816(0),0);
    bVar6 = (bool)((byte)uVar2 & 1);
    fVar5 = (float)((uint)bVar6 * -0x80000000 + (uint)!bVar6 * (int)fVar4);
    local_30 = (int)fVar5 + -1 + (uint)(fVar5 <= 0.0) * 2;
  }
  fVar5 = auVar14._0_4_ * this->high;
  if (-INFINITY < fVar5) {
    auVar14._0_12_ = ZEXT812(0);
    auVar14._12_4_ = 0;
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar5),auVar14,0);
    bVar6 = (bool)((byte)uVar2 & 1);
    fVar9 = (float)((uint)bVar6 * -0x80000000 + (uint)!bVar6 * (int)fVar5);
    local_2c = (int)fVar9 + -1 + (uint)(fVar9 <= 0.0) * 2;
  }
  iVar7 = 0x7f800000;
  fVar9 = INFINITY;
  if (fVar11 < INFINITY) {
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar11),ZEXT816(0) << 0x40,0);
    fVar11 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar11);
    fVar9 = (float)((-(uint)(fVar11 < 0.0) | 1) + (int)fVar11);
  }
  if (fVar3 < INFINITY) {
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar3),ZEXT816(0) << 0x40,0);
    fVar3 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar3);
    iVar7 = (-(uint)(fVar3 < 0.0) | 1) + (int)fVar3;
  }
  iVar10 = 0x7f800000;
  iVar8 = 0x7f800000;
  if (fVar4 < INFINITY) {
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar4),ZEXT816(0) << 0x40,0);
    fVar4 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar4);
    iVar8 = (-(uint)(fVar4 < 0.0) | 1) + (int)fVar4;
  }
  if (fVar5 < INFINITY) {
    uVar2 = vcmpss_avx512f(ZEXT416((uint)fVar5),ZEXT816(0) << 0x40,0);
    fVar5 = (float)((uint)!(bool)((byte)uVar2 & 1) * (int)fVar5);
    iVar10 = (-(uint)(fVar5 < 0.0) | 1) + (int)fVar5;
  }
  __l._M_len = 4;
  __l._M_array = &local_38;
  fVar11 = std::min<float>(__l);
  __l_00._M_len = 4;
  __l_00._M_array = &local_48;
  local_48 = fVar9;
  local_44 = iVar7;
  local_40 = iVar8;
  local_3c = iVar10;
  auVar13._0_4_ = std::max<float>(__l_00);
  auVar13._4_60_ = extraout_var;
  auVar1 = vminss_avx(auVar13._0_16_,ZEXT416((uint)fVar11));
  auVar14 = vmaxss_avx(auVar13._0_16_,ZEXT416((uint)fVar11));
  auVar14 = vinsertps_avx(auVar1,auVar14,0x10);
  return auVar14._0_8_;
}

Assistant:

PBRT_CPU_GPU
    Interval operator*(Interval i) const {
        Float lp[4] = {MulRoundDown(low, i.low), MulRoundDown(high, i.low),
                       MulRoundDown(low, i.high), MulRoundDown(high, i.high)};
        Float hp[4] = {MulRoundUp(low, i.low), MulRoundUp(high, i.low),
                       MulRoundUp(low, i.high), MulRoundUp(high, i.high)};
        return {std::min({lp[0], lp[1], lp[2], lp[3]}),
                std::max({hp[0], hp[1], hp[2], hp[3]})};
    }